

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O3

void __thiscall glu::TextureCube::upload(TextureCube *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  code *pcVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  TransferFormat TVar9;
  pointer pPVar10;
  TestError *this_00;
  pointer pPVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long local_88;
  long lVar8;
  
  iVar5 = (*this->m_context->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  if (this->m_glTexture != 0) {
    (**(code **)(lVar8 + 0xb8))(0x8513);
    pcVar3 = *(code **)(lVar8 + 0xff0);
    uVar6 = tcu::TextureFormat::getPixelSize(&(this->m_refTexture).m_format);
    uVar12 = 8;
    if ((int)uVar6 < 8) {
      uVar12 = uVar6;
    }
    uVar14 = 1;
    if ((uVar6 & uVar6 - 1) == 0) {
      uVar14 = uVar12;
    }
    (*pcVar3)(0xcf5,uVar14);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    checkError(dVar7,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x185);
    TVar9 = getTransferFormat((this->m_refTexture).m_format);
    pPVar10 = (this->m_refTexture).m_access[0].
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar11 = (this->m_refTexture).m_access[0].
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_88 = 0;
    do {
      if (0 < (int)((ulong)((long)pPVar11 - (long)pPVar10) >> 3) * -0x33333333) {
        lVar16 = 8;
        lVar13 = 8;
        uVar15 = 0;
        do {
          if (*(long *)((long)&((this->m_refTexture).m_data[local_88].
                                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar13) != 0) {
            pPVar10 = (this->m_refTexture).m_access[local_88].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar1 = *(undefined4 *)
                     ((long)(pPVar10->super_ConstPixelBufferAccess).m_size.m_data + lVar16 + -8);
            uVar2 = *(undefined4 *)
                     ((long)(pPVar10->super_ConstPixelBufferAccess).m_size.m_data + lVar16 + -4);
            uVar4 = *(undefined8 *)
                     ((long)(pPVar10->super_ConstPixelBufferAccess).m_pitch.m_data + lVar16 + 4);
            pcVar3 = *(code **)(lVar8 + 0x1310);
            dVar7 = getGLCubeFace((CubeFace)local_88);
            (*pcVar3)(dVar7,uVar15 & 0xffffffff,this->m_format,uVar1,uVar2,0,TVar9,
                      (ulong)TVar9 >> 0x20,uVar4);
            pPVar10 = (this->m_refTexture).m_access[0].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pPVar11 = (this->m_refTexture).m_access[0].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 0x10;
          lVar16 = lVar16 + 0x28;
        } while ((long)uVar15 <
                 (long)((int)((ulong)((long)pPVar11 - (long)pPVar10) >> 3) * -0x33333333));
      }
      local_88 = local_88 + 1;
    } while (local_88 != 6);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    checkError(dVar7,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x196);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x182);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCube::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	DE_ASSERT(!m_isCompressed);

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
		{
			if (m_refTexture.isLevelEmpty((tcu::CubeFace)face, levelNdx))
				continue; // Don't upload.

			tcu::ConstPixelBufferAccess access = m_refTexture.getLevelFace(levelNdx, (tcu::CubeFace)face);
			DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
			gl.texImage2D(getGLCubeFace((tcu::CubeFace)face), levelNdx, m_format, access.getWidth(), access.getHeight(), 0 /* border */, transferFormat.format, transferFormat.dataType, access.getDataPtr());
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}